

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::MaybeAddInputVertex
          (S2Builder *this,InputVertexId v,SiteId id,
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *site_vertices)

{
  compact_array_base<int,_std::allocator<int>_> *this_00;
  pointer pcVar1;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar2;
  value_type_conflict2 local_4;
  
  pcVar1 = (site_vertices->
           super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pcVar1 != (site_vertices->
                super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &pcVar1[id].super_compact_array_base<int,_std::allocator<int>_>;
    if ((*(uint *)&pcVar1[id].super_compact_array_base<int,_std::allocator<int>_> & 0xffffff) != 0)
    {
      if (this_00->is_inlined_ == false) {
        paVar2 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
                 (this_00->field_7).pointer_;
      }
      else {
        paVar2 = &this_00->field_7;
      }
      if (*(int *)((long)paVar2 +
                  ((ulong)*(uint *)&pcVar1[id].super_compact_array_base<int,_std::allocator<int>_> &
                  0xffffff) * 4 + -4) == v) {
        return;
      }
    }
    gtl::compact_array_base<int,_std::allocator<int>_>::push_back(this_00,&local_4);
  }
  return;
}

Assistant:

inline void S2Builder::MaybeAddInputVertex(
    InputVertexId v, SiteId id,
    vector<compact_array<InputVertexId>>* site_vertices) const {
  if (site_vertices->empty()) return;

  // Optimization: check if we just added this vertex.  This is worthwhile
  // because the input edges usually form a continuous chain, i.e. the
  // destination of one edge is the same as the source of the next edge.
  auto& vertices = (*site_vertices)[id];
  if (vertices.empty() || vertices.back() != v) {
    vertices.push_back(v);
  }
}